

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zt_time.c
# Opt level: O1

timeval * zt_sub_time(timeval *st,timeval *t1,timeval *t2)

{
  long lVar1;
  long lVar2;
  long lVar3;
  ulong uVar4;
  __suseconds_t _Var5;
  
  st->tv_sec = t1->tv_sec - t2->tv_sec;
  lVar1 = t1->tv_usec;
  lVar2 = t2->tv_usec;
  _Var5 = lVar1 - lVar2;
  if (_Var5 < 0) {
    lVar3 = -1000000;
    if (-1000000 < _Var5) {
      lVar3 = _Var5;
    }
    uVar4 = (ulong)(lVar3 + lVar2 != lVar1);
    uVar4 = (((lVar3 + lVar2) - lVar1) - uVar4) / 1000000 + uVar4;
    _Var5 = ((uVar4 * 1000000 + lVar1) - lVar2) + 1000000;
    st->tv_sec = st->tv_sec + ~uVar4;
  }
  st->tv_usec = _Var5;
  return st;
}

Assistant:

struct timeval *
zt_sub_time(struct timeval *st, struct timeval *t1, struct timeval *t2)
{
    st->tv_sec = t1->tv_sec - t2->tv_sec;
    st->tv_usec = t1->tv_usec - t2->tv_usec;

    while (st->tv_usec < 0) {
        st->tv_sec--;
        st->tv_usec += 1000000;
    }

    return st;
}